

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool consume_pragma(Env *env)

{
  uint uVar1;
  _Bool _Var2;
  bool bVar3;
  _Bool _Var4;
  uint32_t i;
  uint uVar5;
  
  _Var2 = seq_from(env,"{-#",0);
  if (_Var2) {
    bVar3 = seq_from(env,"#-}",0);
    while ((!bVar3 && (_Var4 = (*env->lexer->eof)(env->lexer), !_Var4))) {
      uVar1 = (env->state->lookahead).size;
      (env->state->lookahead).offset = uVar1;
      env->symop = 0;
      uVar5 = uVar1;
      do {
        advance(env);
        uVar5 = uVar5 + 1;
      } while (uVar5 <= uVar1);
      bVar3 = seq_from(env,"#-}",0);
    }
  }
  return _Var2;
}

Assistant:

static bool consume_pragma(Env *env) {
  if (seq(env, "{-#")) {
    while (!seq(env, "#-}") && not_eof(env)) {
      reset_lookahead(env);
      advance_over(env, 0);
    }
    return true;
  }
  return false;
}